

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O1

void __thiscall
ByteData_EqualsUnMatch_Test::~ByteData_EqualsUnMatch_Test(ByteData_EqualsUnMatch_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData, EqualsUnMatch) {
  ByteData byte_data1 = ByteData(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData byte_data2 = ByteData(
      "0234567890123456789012345678901234567890123456789012345678901234");
  bool is_equals = byte_data1.Equals(byte_data2);

  EXPECT_FALSE(is_equals);
}